

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeValves(ProjectWriter *this)

{
  undefined1 *puVar1;
  double dVar2;
  pointer ppLVar3;
  Link *pLVar4;
  long lVar5;
  long lVar6;
  char *__s;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  Curve *pCVar10;
  pointer ppLVar11;
  Valve *valve;
  double extraout_XMM0_Qa;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[VALVES]\n",10);
  ppLVar3 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar11 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl
                  .super__Vector_impl_data._M_start; ppLVar11 != ppLVar3; ppLVar11 = ppLVar11 + 1) {
    pLVar4 = *ppLVar11;
    iVar7 = (*(pLVar4->super_Element)._vptr_Element[2])(pLVar4);
    if (iVar7 == 2) {
      lVar5 = *(long *)&this->field_0x18;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(&this->field_0x30 + lVar6) =
           *(uint *)(&this->field_0x30 + lVar6) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0x10;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pLVar4->super_Element).name._M_dataplus._M_p,
                          (pLVar4->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(pLVar4->fromNode->super_Element).name._M_dataplus._M_p,
                 (pLVar4->fromNode->super_Element).name._M_string_length);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(pLVar4->toNode->super_Element).name._M_dataplus._M_p,
                 (pLVar4->toNode->super_Element).name._M_string_length);
      lVar5 = *(long *)&this->field_0x18;
      *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>(pLVar4->diameter * (this->network->units).factors[0]);
      lVar5 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 8;
      __s = Valve::ValveTypeWords[*(int *)&pLVar4[1].super_Element._vptr_Element];
      if (__s == (char *)0x0) {
        std::ios::clear((int)puVar1 + (int)*(undefined8 *)(lVar5 + -0x18));
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,__s,sVar9);
      }
      if (*(int *)&pLVar4[1].super_Element._vptr_Element == 5) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        pCVar10 = Network::curve(this->network,(int)pLVar4->initSetting);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(pCVar10->super_Element).name._M_dataplus._M_p,
                            (pCVar10->super_Element).name._M_string_length);
      }
      else {
        dVar2 = pLVar4->initSetting;
        (*(pLVar4->super_Element)._vptr_Element[5])(pLVar4,this->network);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        poVar8 = std::ostream::_M_insert<double>((dVar2 / extraout_XMM0_Qa) * pLVar4->initSetting);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeValves()
{
    fout << "\n[VALVES]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::VALVE )
        {
            Valve* valve = static_cast<Valve*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);
            fout << setw(12) << valve->diameter*network->ucf(Units::DIAMETER);
            fout << setw(8) << Valve::ValveTypeWords[(int)valve->valveType];

            if (valve->valveType == Valve::GPV)
            {
                fout << setw(16) << network->curve((int)link->initSetting)->name << "\n";
            }
            else
            {
                double cf = link->initSetting /
                            link->convertSetting(network, link->initSetting);
                fout << setw(12) << cf * link->initSetting << "\n";
            }
        }
    }
}